

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::SetDisableThreadAccessCheck(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachNonLeafPageAllocator<Memory::HeapInfo::SetDisableThreadAccessCheck()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::SetDisableThreadAccessCheck()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator* pageAlloc)
    {
        pageAlloc->SetDisableThreadAccessCheck();
    });
}